

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.cpp
# Opt level: O2

void * SSC32Thread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int local_cb0;
  int local_cac;
  double local_ca8;
  double local_c88;
  CHRONO chrono_period;
  char szTemp [256];
  SSC32 ssc32;
  char szSaveFilePath [256];
  
  memset(&ssc32,0,0x9e8);
  StartChrono(&chrono_period);
  local_cb0 = 0x32;
  bVar4 = false;
  bVar2 = false;
  local_cac = 0;
LAB_0016d449:
  bVar2 = !bVar2;
  while( true ) {
    StopChronoQuick(&chrono_period);
    StartChrono(&chrono_period);
    mSleep((long)local_cb0);
    if (bPauseSSC32 == 0) break;
    if (!bVar2) {
      puts("SSC32 paused.");
      DisconnectSSC32(&ssc32);
    }
    if (bExit != 0) goto LAB_0016da5f;
    mSleep(100);
    bVar2 = true;
  }
  if (bRestartSSC32 == 0) {
    if (bVar2) goto LAB_0016d4fa;
    if (robid == 0x400) {
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      rudderminangle = ssc32.MinAngle;
      ruddermidangle = ssc32.MidAngle;
      ruddermaxangle = ssc32.MaxAngle;
      dVar13 = -uw_f;
      dVar14 = ABS(ssc32.MinAngle);
      if (ABS(ssc32.MinAngle) <= ABS(ssc32.MaxAngle)) {
        dVar14 = ABS(ssc32.MaxAngle);
      }
      if (bEnableFluxMotorboat == 0) {
        if (bEnableBackwardsMotorboat == 0) {
          uVar10 = 0;
          uVar11 = 0;
          if (0.0 <= u_f) {
            uVar10 = SUB84(u_f,0);
            uVar11 = (undefined4)((ulong)u_f >> 0x20);
          }
          local_ca8 = (double)CONCAT44(uVar11,uVar10);
        }
        else {
          local_ca8 = u_f;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        iVar6 = SetRudderThrusterSSC32(&ssc32,dVar14 * dVar13,local_ca8);
      }
      else {
        local_c88 = ABS(u_f);
        if (bEnableBackwardsMotorboat == 0) {
          local_c88 = (double)(~-(ulong)(u_f < 0.0) & (ulong)local_c88);
          local_ca8 = 1.0;
        }
        else {
          local_ca8 = *(double *)(&DAT_0019e5b0 + (ulong)(u_f < 0.0) * 8);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        iVar6 = SetRudderThrustersFluxSSC32
                          (&ssc32,dVar14 * dVar13,local_c88,local_c88,local_ca8,local_ca8);
      }
      if (iVar6 == 0) goto LAB_0016da49;
      puts("Connection to a SSC32 lost.");
      DisconnectSSC32(&ssc32);
      goto LAB_0016d517;
    }
    if (robid == 0x2000) {
      if (!bVar4 && bCheckRudder != 0) {
        iVar6 = CheckRudderSSC32(&ssc32);
        bVar4 = true;
        if (iVar6 != 0) {
          puts("Connection to a SSC32 lost.");
          DisconnectSSC32(&ssc32);
          bVar4 = false;
          goto LAB_0016d517;
        }
      }
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      rudderminangle = ssc32.MinAngle;
      ruddermidangle = ssc32.MidAngle;
      ruddermaxangle = ssc32.MaxAngle;
      dVar13 = -uw_f;
      dVar14 = ABS(ssc32.MinAngle);
      if (ABS(ssc32.MinAngle) <= ABS(ssc32.MaxAngle)) {
        dVar14 = ABS(ssc32.MaxAngle);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      iVar6 = SetRudderSSC32(&ssc32,dVar14 * dVar13);
    }
    else if (((robid == 0x4000) || (robid == 0x200000)) || (robid == 0x8000)) {
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      dVar14 = u_f;
      rudderminangle = ssc32.MinAngle;
      ruddermidangle = ssc32.MidAngle;
      ruddermaxangle = ssc32.MaxAngle;
      dVar12 = -uw_f;
      dVar13 = ABS(ssc32.MinAngle);
      if (ABS(ssc32.MinAngle) <= ABS(ssc32.MaxAngle)) {
        dVar13 = ABS(ssc32.MaxAngle);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      iVar6 = SetRudderThrusterSSC32(&ssc32,dVar13 * dVar12,dVar14);
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      dVar13 = u2;
      dVar14 = u1;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      iVar6 = SetThrustersSSC32(&ssc32,dVar14,dVar13);
    }
    if (iVar6 != 0) {
      puts("Connection to a SSC32 lost.");
      DisconnectSSC32(&ssc32);
      goto LAB_0016d517;
    }
  }
  else {
    if (!bVar2) {
      puts("Restarting a SSC32.");
      DisconnectSSC32(&ssc32);
    }
    bRestartSSC32 = 0;
LAB_0016d4fa:
    iVar6 = ConnectSSC32(&ssc32,"SSC320.txt");
    if (iVar6 != 0) {
      mSleep(1000);
LAB_0016d517:
      local_cac = local_cac + 1;
      if (ExitOnErrorCount <= local_cac && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_0016da5f:
        bVar3 = true;
        goto LAB_0016da62;
      }
      bVar2 = false;
      bVar3 = true;
      goto LAB_0016da4c;
    }
    local_cb0 = ssc32.threadperiod;
    if (ssc32.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)ssc32.pfSaveFile);
      ssc32.pfSaveFile = (FILE *)0x0;
    }
    if (ssc32.bSaveRawData != 0) {
      if (ssc32.szCfgFilePath[0] == '\0') {
        builtin_strncpy(szTemp,"ssc32",6);
      }
      else {
        sprintf(szTemp,"%.127s",ssc32.szCfgFilePath);
      }
      sVar7 = strlen(szTemp);
      iVar6 = (int)sVar7 + 1;
      uVar9 = sVar7 & 0xffffffff;
      do {
        if ((int)uVar9 < 1) goto LAB_0016d6fc;
        uVar1 = uVar9 - 1;
        iVar6 = iVar6 + -1;
        lVar5 = uVar9 - 1;
        uVar9 = uVar1;
      } while (szTemp[lVar5] != '.');
      if ((uVar1 != 0) && (iVar6 <= (int)sVar7)) {
        memset(szTemp + (uVar1 & 0xffffffff),0,sVar7 - (uVar1 & 0xffffffff));
      }
LAB_0016d6fc:
      pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
      pcVar8 = strtimeex_fns();
      sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar8);
      pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
      ssc32.pfSaveFile = (FILE *)fopen(szSaveFilePath,"wb");
      if ((FILE *)ssc32.pfSaveFile != (FILE *)0x0) goto LAB_0016da49;
      puts("Unable to create SSC32 data file.");
      bVar3 = false;
      goto LAB_0016da62;
    }
  }
LAB_0016da49:
  bVar3 = false;
  bVar2 = true;
LAB_0016da4c:
  if (bExit != 0) goto LAB_0016da62;
  goto LAB_0016d449;
LAB_0016da62:
  if (robid == 0x400) {
    if (bEnableFluxMotorboat == 0) {
      SetRudderThrusterSSC32(&ssc32,0.0,0.0);
    }
    else {
LAB_0016dab4:
      SetRudderThrustersFluxSSC32(&ssc32,0.0,0.0,0.0,0.0,0.0);
    }
  }
  else {
    if (((robid == 0x2000) || (robid == 0x4000)) || (robid == 0x8000)) goto LAB_0016dade;
    if (robid == 0x200000) goto LAB_0016dab4;
    SetThrustersSSC32(&ssc32,0.0,0.0);
  }
  mSleep((long)local_cb0);
LAB_0016dade:
  StopChronoQuick(&chrono_period);
  if (ssc32.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)ssc32.pfSaveFile);
    ssc32.pfSaveFile = (FILE *)0x0;
  }
  if (!bVar3) {
    DisconnectSSC32(&ssc32);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SSC32Thread(void* pParam)
{
	SSC32 ssc32;
	double rudder = 0, thrust = 0, flux = 0;
	double thrust1 = 0, thrust2 = 0;
	BOOL bRudderChecked = FALSE;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ssc32, 0, sizeof(SSC32));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseSSC32) 
		{
			if (bConnected)
			{
				printf("SSC32 paused.\n");
				bConnected = FALSE;
				DisconnectSSC32(&ssc32);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSSC32) 
		{
			if (bConnected)
			{
				printf("Restarting a SSC32.\n");
				bConnected = FALSE;
				DisconnectSSC32(&ssc32);
			}
			bRestartSSC32 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSSC32(&ssc32, "SSC320.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ssc32.threadperiod;

				if (ssc32.pfSaveFile != NULL)
				{
					fclose(ssc32.pfSaveFile); 
					ssc32.pfSaveFile = NULL;
				}
				if ((ssc32.bSaveRawData)&&(ssc32.pfSaveFile == NULL)) 
				{
					if (strlen(ssc32.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ssc32.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ssc32");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ssc32.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (ssc32.pfSaveFile == NULL) 
					{
						printf("Unable to create SSC32 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case BUGGY_ROBID:
			case SAILBOAT_ROBID:
			case SAILBOAT2_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				thrust = u_f;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrusterSSC32(&ssc32, rudder, thrust) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			case VAIMOS_ROBID:
				if ((bCheckRudder)&&(!bRudderChecked))
				{
					if (CheckRudderSSC32(&ssc32) != EXIT_SUCCESS)
					{
						printf("Connection to a SSC32 lost.\n");
						bConnected = FALSE;
						DisconnectSSC32(&ssc32);
						break;
					}
					bRudderChecked = TRUE;
				}
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderSSC32(&ssc32, rudder) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			case MOTORBOAT_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				if (bEnableFluxMotorboat)
				{
				thrust = fabs(u_f);
				if (bEnableBackwardsMotorboat)
				{
					if (u_f < 0) flux = -1; else flux = 1;
				}
				else
				{
					if (u_f < 0) thrust = 0;
					flux = 1;
				}
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrustersFluxSSC32(&ssc32, rudder, thrust, thrust, flux, flux) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				}
				else
				{
				thrust = u_f;
				if (!bEnableBackwardsMotorboat)
				{
					if (u_f < 0) thrust = 0;
				}
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrusterSSC32(&ssc32, rudder, thrust) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				}
				break;
			case BUBBLE_ROBID:
			case ETAS_WHEEL_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetThrustersSSC32(&ssc32, thrust1, thrust2) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			}
		}

		//printf("SSC32Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUGGY_ROBID:
		SetRudderThrustersFluxSSC32(&ssc32, 0, 0, 0, 0, 0);
		mSleep(threadperiod);
		break;
	case SAILBOAT_ROBID:
	case SAILBOAT2_ROBID:
	case VAIMOS_ROBID:
		break;
	case MOTORBOAT_ROBID:
		if (bEnableFluxMotorboat) SetRudderThrustersFluxSSC32(&ssc32, 0, 0, 0, 0, 0); else SetRudderThrusterSSC32(&ssc32, 0, 0);
		mSleep(threadperiod);
		break;
	case BUBBLE_ROBID:
	case ETAS_WHEEL_ROBID:
	default:
		SetThrustersSSC32(&ssc32, 0, 0);
		mSleep(threadperiod);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (ssc32.pfSaveFile != NULL)
	{
		fclose(ssc32.pfSaveFile); 
		ssc32.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectSSC32(&ssc32);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}